

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O1

QString * __thiscall
SecurityDirWrapper::getFieldName
          (QString *__return_storage_ptr__,SecurityDirWrapper *this,size_t fieldId)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  switch(fieldId) {
  case 0:
    psVar1 = (storage_type *)0x6;
    break;
  case 1:
    psVar1 = (storage_type *)0x8;
    break;
  case 2:
    psVar1 = (storage_type *)0x4;
    break;
  case 3:
    psVar1 = (storage_type *)0xd;
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CERT_LEN : return "Length";
        case REVISION : return "Revision";
        case TYPE : return "Type";
        case CERT_CONTENT : return "Cert. Content";
    }
    return getName();
}